

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

bigint<13> * __thiscall bigint<13>::sub<13,1>(bigint<13> *this,bigint<13> *x,bigint<1> *y)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  operator>=(x,y);
  iVar2 = y->len;
  uVar1 = 0;
  for (uVar4 = 0; ((long)uVar1 < (long)iVar2 || (uVar4 != 0)); uVar4 = uVar4 >> 0x10 ^ 1) {
    uVar3 = 0;
    if ((long)uVar1 < (long)iVar2) {
      uVar3 = (uint)y->digits[uVar1];
    }
    uVar4 = (x->digits[uVar1] | 0x10000) - (uVar4 + uVar3);
    this->digits[uVar1] = (digit)uVar4;
    uVar1 = uVar1 + 1;
  }
  iVar2 = x->len;
  if (this != x && (int)uVar1 < iVar2) {
    memcpy(this->digits + (uVar1 & 0xffffffff),x->digits + (uVar1 & 0xffffffff),
           (long)(iVar2 - (int)uVar1) * 2);
    iVar2 = x->len;
  }
  this->len = iVar2;
  shrink(this);
  return this;
}

Assistant:

bigint &sub(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        ASSERT(x >= y);
        dbldigit borrow = 0;
        int i;
        for(i = 0; i < y.len || borrow; i++)
        {
             borrow = (1<<BI_DIGIT_BITS) + (dbldigit)x.digits[i] - (i<y.len ? (dbldigit)y.digits[i] : 0) - borrow;
             digits[i] = (digit)borrow;
             borrow = (borrow>>BI_DIGIT_BITS)^1;
        }
        if(i < x.len && this != &x) memcpy(&digits[i], &x.digits[i], (x.len - i)*sizeof(digit));
        len = x.len;
        shrink();
        return *this;
    }